

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O2

void __thiscall wasm::UnneededSetRemover::visitLocalSet(UnneededSetRemover *this,LocalSet *curr)

{
  Id IVar1;
  LocalSet *pLVar2;
  
  pLVar2 = curr;
  if ((this->localGetCounter->num).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[curr->index] == 0) {
    remove(this,(char *)curr);
  }
  do {
    pLVar2 = (LocalSet *)pLVar2->value;
    IVar1 = (pLVar2->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id;
    if (IVar1 != LocalSetId) {
      if ((IVar1 != LocalGetId) || (pLVar2->index != curr->index)) {
        return;
      }
      break;
    }
  } while (pLVar2->index != curr->index);
  remove(this,(char *)curr);
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    // If no possible uses, remove.
    if (localGetCounter->num[curr->index] == 0) {
      remove(curr);
    }
    // If setting the same value as we already have, remove.
    auto* value = curr->value;
    while (true) {
      if (auto* set = value->dynCast<LocalSet>()) {
        if (set->index == curr->index) {
          remove(curr);
        } else {
          // Handle tee chains.
          value = set->value;
          continue;
        }
      } else if (auto* get = value->dynCast<LocalGet>()) {
        if (get->index == curr->index) {
          remove(curr);
        }
      }
      break;
    }
  }